

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O1

int vector2_equals(vector2 *self,vector2 *vT)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = (self->field_0).v[0] - (vT->field_0).v[0];
  dVar3 = -dVar2;
  if (-dVar2 <= dVar2) {
    dVar3 = dVar2;
  }
  uVar1 = 0;
  if (dVar3 < 1e-05) {
    dVar2 = (self->field_0).v[1] - (vT->field_0).v[1];
    dVar3 = -dVar2;
    if (-dVar2 <= dVar2) {
      dVar3 = dVar2;
    }
    uVar1 = (uint)(dVar3 < 1e-05);
  }
  return uVar1;
}

Assistant:

HYPAPI int vector2_equals(const struct vector2 *self, const struct vector2 *vT)
{
	return scalar_equals(self->x, vT->x) && scalar_equals(self->y, vT->y);
}